

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_factory.cxx
# Opt level: O0

cse_abstract * __thiscall
factory_item<xray_re::cse_alife_item_explosive>::create
          (factory_item<xray_re::cse_alife_item_explosive> *this)

{
  cse_abstract *this_00;
  anon_union_8_3_e9edf90f_for_xr_clsid_0 *paVar1;
  anon_union_8_3_e9edf90f_for_xr_clsid_0 *paVar2;
  cse_alife_item_explosive *p;
  factory_item<xray_re::cse_alife_item_explosive> *this_local;
  
  this_00 = (cse_abstract *)operator_new(0x200);
  xray_re::cse_alife_item_explosive::cse_alife_item_explosive((cse_alife_item_explosive *)this_00);
  paVar1 = &factory_item_base::clsid(&this->super_factory_item_base)->field_0;
  paVar2 = &xray_re::cse_abstract::clsid(this_00)->field_0;
  *paVar2 = *paVar1;
  return this_00;
}

Assistant:

cse_abstract* factory_item<T>::create()
{
	T* p = new T;
	p->clsid() = clsid();
	return p;
}